

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashBinGeneric.h
# Opt level: O2

DnsPrefixEntry * __thiscall
BinHash<DnsPrefixEntry>::DoInsert
          (BinHash<DnsPrefixEntry> *this,DnsPrefixEntry *key,bool need_alloc,bool *stored)

{
  bool bVar1;
  uint32_t uVar2;
  DnsPrefixEntry *key_00;
  DnsPrefixEntry *pDVar3;
  
  *stored = false;
  key_00 = (DnsPrefixEntry *)0x0;
  if ((key != (DnsPrefixEntry *)0x0) && (this->tableSize != 0)) {
    uVar2 = DnsPrefixEntry::Hash(key);
    pDVar3 = (DnsPrefixEntry *)(this->hashBin + (ulong)uVar2 % (ulong)this->tableSize);
    key_00 = pDVar3;
    do {
      key_00 = key_00->HashNext;
      if (key_00 == (DnsPrefixEntry *)0x0) {
        if (need_alloc) {
          return (DnsPrefixEntry *)0x0;
        }
        key->HashNext = pDVar3->HashNext;
        pDVar3->HashNext = key;
        *stored = true;
        this->tableCount = this->tableCount + 1;
        return key;
      }
      bVar1 = DnsPrefixEntry::IsSameKey(key,key_00);
    } while (!bVar1);
    *stored = false;
  }
  return key_00;
}

Assistant:

KeyObj * DoInsert(KeyObj * key, bool need_alloc, bool * stored)
    {
        KeyObj * retKey = NULL;

        *stored = false;

        if (key != NULL && tableSize > 0)
        {
            uint32_t hash_index = key->Hash() % tableSize;
            KeyObj * oldKey = hashBin[hash_index];

            while (oldKey != NULL && !key->IsSameKey(oldKey))
            {
                oldKey = oldKey->HashNext;
            }

            if (oldKey != NULL)
            {
                /* the keyed object is already in the table*/
                oldKey->Add(key);
                retKey = oldKey;
                *stored = false;
            }
            else
            {
                retKey = key;

                if (need_alloc)
                {
                    retKey = key->CreateCopy();
                }

                if (retKey != NULL)
                {
                    retKey->HashNext = hashBin[hash_index];
                    hashBin[hash_index] = retKey;
                    *stored = true;
                    tableCount++;
                }
            }
        }

        return retKey;
    }